

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

command __thiscall Editor::checkCommand(Editor *this,string *input)

{
  bool bVar1;
  undefined1 local_130 [8];
  regex insertNumExpr;
  regex insertExpr;
  regex deleteNumMExpr;
  regex deleteNumExpr;
  regex deleteExpr;
  regex listNumMExpr;
  undefined1 local_60 [8];
  regex listNumExpr;
  regex listExpr;
  string *input_local;
  Editor *this_local;
  
  bVar1 = std::operator==(input,"E");
  if (bVar1) {
    this_local._4_4_ = cmdE;
  }
  else {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &listNumExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"[L]",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60,"[L][\\s][0-9]+",
               0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &deleteExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"[L][\\s][0-9]+[\\s][0-9]+",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &deleteNumExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"[D]",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &deleteNumMExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"[D][\\s][0-9]+",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &insertExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"[D][\\s][0-9]+[\\s][0-9]+",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &insertNumExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"[I]",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_130,"[I][\\s][0-9]+",
               0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                             &listNumExpr._M_automaton.
                              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,0);
    if (bVar1) {
      this_local._4_4_ = cmdL;
    }
    else {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               &deleteNumExpr._M_automaton.
                                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,0);
      if (bVar1) {
        this_local._4_4_ = cmdD;
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                 &insertNumExpr._M_automaton.
                                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,0);
        if (bVar1) {
          this_local._4_4_ = cmdI;
        }
        else {
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60,
                             0);
          if (bVar1) {
            this_local._4_4_ = cmdLn;
          }
          else {
            bVar1 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     &deleteNumMExpr._M_automaton.
                                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,0);
            if (bVar1) {
              this_local._4_4_ = cmdDn;
            }
            else {
              bVar1 = std::
                      regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       local_130,0);
              if (bVar1) {
                this_local._4_4_ = cmdIn;
              }
              else {
                bVar1 = std::
                        regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                  (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                         &deleteExpr._M_automaton.
                                          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,0);
                if (bVar1) {
                  this_local._4_4_ = cmdLnm;
                }
                else {
                  bVar1 = std::
                          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                           &insertExpr._M_automaton.
                                            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,0);
                  if (bVar1) {
                    this_local._4_4_ = cmdDnm;
                  }
                  else {
                    this_local._4_4_ = cmdNone;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_130);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &insertNumExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &insertExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &deleteNumMExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &deleteNumExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &deleteExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &listNumExpr._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return this_local._4_4_;
}

Assistant:

command Editor::checkCommand(const std::string &input) {

    // If the command is E, return right away.
    if (input == "E") return cmdE;

    // Else define regex expression for each command
    std::regex listExpr("[L]"); // Just an L
    std::regex listNumExpr("[L][\\s][0-9]+"); // L followed by whitespace followed by any number of digits
    std::regex listNumMExpr("[L][\\s][0-9]+[\\s][0-9]+"); // L -> space -> any num of digits -> space -> any num of digits

    std::regex deleteExpr("[D]");
    std::regex deleteNumExpr("[D][\\s][0-9]+");
    std::regex deleteNumMExpr("[D][\\s][0-9]+[\\s][0-9]+");

    std::regex insertExpr("[I]");
    std::regex insertNumExpr("[I][\\s][0-9]+");

    // Return corresponding enum for the expression
    if (regex_match(input, listExpr)) return cmdL;
    if (regex_match(input, deleteExpr)) return cmdD;
    if (regex_match(input, insertExpr)) return cmdI;
    if (regex_match(input, listNumExpr)) return cmdLn;
    if (regex_match(input, deleteNumExpr)) return cmdDn;
    if (regex_match(input, insertNumExpr)) return cmdIn;
    if (regex_match(input, listNumMExpr)) return cmdLnm;
    if (regex_match(input, deleteNumMExpr)) return cmdDnm;

    return cmdNone;
}